

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

bool __thiscall QToolBarLayout::layoutActions(QToolBarLayout *this,QSize *size)

{
  QToolBarItem *pQVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Orientation OVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QToolBar *pQVar10;
  QStyle *pQVar11;
  qsizetype qVar12;
  reference pQVar13;
  undefined4 extraout_var;
  const_reference ppQVar14;
  int *piVar15;
  long lVar16;
  QList<QWidget_*> *this_00;
  QList<QLayoutStruct> *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QRect QVar17;
  int i_2;
  int i_1;
  QToolBarItem *item_1;
  int j_1;
  QToolBarItem *item;
  int j;
  int newSize;
  bool expansiveRow;
  int maximumSize;
  int count;
  int prev;
  int size_1;
  int start;
  int i;
  int rowPos;
  int rows;
  bool ranOutOfSpace;
  int space;
  bool extensionMenuContainsOnlyWidgetActions;
  Orientation o;
  int extensionExtent;
  int spacing;
  int handleExtent;
  QStyle *style;
  QToolBar *tb;
  QRect r;
  QSize size_2;
  QPoint pos;
  int rowHeight;
  QList<QLayoutStruct> a;
  QMargins margins;
  QList<QWidget_*> hideWidgets;
  QList<QWidget_*> showWidgets;
  QRect rect;
  QStyleOptionToolBar opt;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  QWidget *in_stack_fffffffffffffd80;
  QToolBarLayout *in_stack_fffffffffffffd88;
  QToolBarItem *in_stack_fffffffffffffd90;
  QWidget *this_01;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  QRect *in_stack_fffffffffffffda0;
  LayoutDirection in_stack_fffffffffffffdac;
  int local_21c;
  byte local_211;
  int local_208;
  undefined4 in_stack_fffffffffffffe28;
  int iVar18;
  undefined4 in_stack_fffffffffffffe2c;
  int local_1c8;
  int local_1c4;
  int local_1b4;
  int local_1a8;
  byte local_19d;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_188;
  int local_184;
  int local_180;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  QSize local_110;
  undefined1 *local_108;
  undefined1 *local_f8;
  undefined8 local_f0;
  int local_e8;
  int local_e4;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  QPoint local_c0;
  QSize local_b8;
  undefined1 local_b0 [16];
  QList<QWidget_*> local_a0;
  QList<QWidget_*> local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 9) & 1) != 0) {
    updateGeomArray((QToolBarLayout *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
    ;
  }
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::width((QSize *)0x6fe52a);
  QSize::height((QSize *)0x6fe53e);
  QRect::QRect((QRect *)in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
               (int)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78);
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x6fe593);
  local_a0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a0.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_a0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x6fe5cd);
  QLayout::parentWidget((QLayout *)in_stack_fffffffffffffd90);
  pQVar10 = qobject_cast<QToolBar*>((QObject *)0x6fe5e2);
  if (pQVar10 == (QToolBar *)0x0) {
    bVar2 = false;
  }
  else {
    pQVar11 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    memset(local_60,0xaa,0x58);
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6fe646);
    (**(code **)(*(long *)&pQVar10->super_QWidget + 0x1a0))(pQVar10,local_60);
    bVar2 = movable(in_stack_fffffffffffffd88);
    if (bVar2) {
      iVar18 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x35,local_60,pQVar10);
    }
    else {
      iVar18 = 0;
    }
    local_b0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = (undefined1  [16])QLayout::contentsMargins(&in_stack_fffffffffffffd88->super_QLayout)
    ;
    iVar4 = (**(code **)(*in_RDI + 0x60))();
    iVar5 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x39,local_60,pQVar10);
    OVar6 = QToolBar::orientation((QToolBar *)in_stack_fffffffffffffd80);
    local_b8 = QRect::size((QRect *)in_stack_fffffffffffffd90);
    iVar7 = pick((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                 (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    iVar8 = pick((Orientation)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                 (QMargins *)in_stack_fffffffffffffd88);
    iVar7 = (iVar7 - iVar8) - iVar18;
    if (iVar7 < 1) {
      bVar2 = false;
    }
    else {
      if (in_RDI[0x10] != 0) {
        QMenu::clear((QMenu *)in_stack_fffffffffffffd90);
      }
      bVar2 = false;
      local_180 = 0;
      local_c0 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffd7c,
                                                  in_stack_fffffffffffffd78));
      local_184 = perp((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      QMargins::top((QMargins *)0x6fe872);
      QMargins::left((QMargins *)0x6fe886);
      QSize::QSize((QSize *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                   in_stack_fffffffffffffd78);
      iVar8 = perp((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                   (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_184 = local_184 + iVar8;
      local_188 = 0;
      while (local_1a8 = local_188,
            qVar12 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4)),
            local_188 < qVar12) {
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_d0 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QLayoutStruct>::QList
                  ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                   (QList<QLayoutStruct> *)
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        local_190 = 0;
        local_194 = -1;
        local_e4 = 0;
        local_198 = 0;
        local_19c = 0;
        local_19d = 0;
        for (; qVar12 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4)),
            local_188 < qVar12; local_188 = local_188 + 1) {
          pQVar13 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          if ((pQVar13->empty & 1U) == 0) {
            local_208 = iVar4;
            if (local_198 == 0) {
              local_208 = 0;
            }
            pQVar13 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            iVar8 = local_190 + local_208 + pQVar13->minimumSize;
            if ((local_194 != -1) && (iVar7 < iVar8)) {
              if (local_180 == 0) {
                bVar2 = true;
              }
              if ((1 < local_198) && (iVar7 < local_190 + iVar4 + iVar5)) {
                local_188 = local_194;
              }
              break;
            }
            if ((*(byte *)((long)in_RDI + 0x1c) & 1) != 0) {
              ppQVar14 = QList<QToolBarItem_*>::at
                                   ((QList<QToolBarItem_*> *)in_stack_fffffffffffffd80,
                                    CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
              iVar9 = (*((*ppQVar14)->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[2])();
              local_f0 = CONCAT44(extraout_var,iVar9);
              local_e8 = perp((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                              (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                             );
              piVar15 = qMax<int>(&local_e4,&local_e8);
              local_e4 = *piVar15;
            }
            local_211 = 1;
            if (local_19d == 0) {
              pQVar13 = QList<QLayoutStruct>::operator[]
                                  ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
              local_211 = pQVar13->expansive;
            }
            local_19d = local_211 & 1;
            pQVar13 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            if ((pQVar13->expansive & 1U) == 0) {
              pQVar13 = QList<QLayoutStruct>::operator[]
                                  ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
              local_21c = QLayoutStruct::smartSizeHint(pQVar13);
            }
            else {
              pQVar13 = QList<QLayoutStruct>::operator[]
                                  ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
              local_21c = pQVar13->maximumSize;
            }
            local_19c = iVar4 + local_21c + local_19c;
            local_194 = local_188;
            local_198 = local_198 + 1;
            local_190 = iVar8;
          }
        }
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        pQVar13->sizeHint = 0;
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        pQVar13->maximumSize = 0xffffff;
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        pQVar13->minimumSize = 0;
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        pQVar13->expansive = true;
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        pQVar13->stretch = 0;
        pQVar13 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        pQVar13->empty = true;
        if ((local_19d != 0) && (local_19c < iVar7)) {
          pQVar13 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          pQVar13->maximumSize = iVar7 - local_19c;
        }
        qGeomCalc(in_RSI,(int)((ulong)pQVar10 >> 0x20),(int)pQVar10,in_stack_fffffffffffffeac,
                  in_stack_fffffffffffffea8,(int)((ulong)pQVar11 >> 0x20));
        for (; local_1a8 < local_188; local_1a8 = local_1a8 + 1) {
          ppQVar14 = QList<QToolBarItem_*>::at
                               ((QList<QToolBarItem_*> *)in_stack_fffffffffffffd80,
                                CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          pQVar1 = *ppQVar14;
          pQVar13 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          if ((pQVar13->empty & 1U) == 0) {
            local_f8 = &DAT_aaaaaaaaaaaaaaaa;
            QPoint::QPoint((QPoint *)in_stack_fffffffffffffd80);
            QMargins::top((QMargins *)0x6fee82);
            QMargins::left((QMargins *)0x6fee93);
            QSize::QSize((QSize *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                         in_stack_fffffffffffffd78);
            iVar9 = pick((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                         (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            pQVar13 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            iVar8 = pQVar13->pos;
            piVar15 = rpick((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                            (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))
            ;
            *piVar15 = iVar9 + iVar18 + iVar8;
            piVar15 = rperp((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                            (QPoint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))
            ;
            *piVar15 = local_184;
            local_108 = &DAT_aaaaaaaaaaaaaaaa;
            QSize::QSize((QSize *)in_stack_fffffffffffffd80);
            pQVar13 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)in_stack_fffffffffffffd80,
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            iVar8 = pQVar13->size;
            piVar15 = rpick((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                            (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            iVar9 = local_e4;
            *piVar15 = iVar8;
            if ((*(byte *)((long)in_RDI + 0x1c) & 1) == 0) {
              local_110 = QRect::size((QRect *)in_stack_fffffffffffffd90);
              in_stack_fffffffffffffdac =
                   perp((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                        (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
              iVar8 = perp((Orientation)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                           (QMargins *)in_stack_fffffffffffffd88);
              iVar8 = in_stack_fffffffffffffdac - iVar8;
              piVar15 = rperp((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                              (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                             );
              *piVar15 = iVar8;
            }
            else {
              piVar15 = rperp((Orientation)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                              (QSize *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                             );
              *piVar15 = iVar9;
            }
            local_120 = &DAT_aaaaaaaaaaaaaaaa;
            local_118 = &DAT_aaaaaaaaaaaaaaaa;
            QRect::QRect(in_stack_fffffffffffffda0,
                         (QPoint *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                         (QSize *)in_stack_fffffffffffffd90);
            if (OVar6 == Horizontal) {
              QLayout::parentWidget((QLayout *)in_stack_fffffffffffffd90);
              QWidget::layoutDirection((QWidget *)0x6ff077);
              QVar17 = QStyle::visualRect(in_stack_fffffffffffffdac,in_stack_fffffffffffffda0,
                                          (QRect *)CONCAT17(in_stack_fffffffffffffd9f,
                                                            in_stack_fffffffffffffd98));
              local_130 = QVar17._0_8_;
              local_120 = local_130;
              local_128 = QVar17._8_8_;
              local_118 = local_128;
            }
            (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[6])(pQVar1,&local_120)
            ;
            (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
            bVar3 = QWidget::isHidden((QWidget *)0x6ff0ea);
            if (bVar3) {
              (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
              QList<QWidget_*>::operator<<
                        ((QList<QWidget_*> *)in_stack_fffffffffffffd80,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            }
          }
          else {
            (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
            bVar3 = QWidget::isHidden((QWidget *)0x6fee27);
            if (!bVar3) {
              (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
              QList<QWidget_*>::operator<<
                        ((QList<QWidget_*> *)in_stack_fffffffffffffd80,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            }
          }
        }
        if ((*(byte *)((long)in_RDI + 0x1c) & 1) == 0) {
          local_1b4 = local_188;
          while( true ) {
            in_stack_fffffffffffffda0 = (QRect *)(long)local_1b4;
            qVar12 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4));
            if (qVar12 <= (long)in_stack_fffffffffffffda0) break;
            ppQVar14 = QList<QToolBarItem_*>::at
                                 ((QList<QToolBarItem_*> *)in_stack_fffffffffffffd80,
                                  CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            pQVar1 = *ppQVar14;
            (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
            bVar3 = QWidget::isHidden((QWidget *)0x6ff1af);
            if (!bVar3) {
              (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
              QList<QWidget_*>::operator<<
                        ((QList<QWidget_*> *)in_stack_fffffffffffffd80,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            }
            if ((in_RDI[0x10] != 0) &&
               (bVar3 = defaultWidgetAction(in_stack_fffffffffffffd90), !bVar3)) {
              QWidget::addAction(in_stack_fffffffffffffd80,
                                 (QAction *)
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            }
            local_1b4 = local_1b4 + 1;
          }
          iVar8 = 3;
        }
        else {
          local_184 = local_e4 + iVar4 + local_184;
          local_180 = local_180 + 1;
          iVar8 = 0;
        }
        QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x6ff288);
        if (iVar8 != 0) break;
        in_stack_fffffffffffffeac = 0;
      }
      this_01 = (QWidget *)in_RDI[0xf];
      QWidget::setEnabled(this_01,SUB81((ulong)in_stack_fffffffffffffd88 >> 0x38,0));
      local_1c4 = 0;
      while( true ) {
        lVar16 = (long)local_1c4;
        qVar12 = QList<QWidget_*>::size(&local_88);
        if (qVar12 <= lVar16) break;
        QList<QWidget_*>::at
                  ((QList<QWidget_*> *)in_stack_fffffffffffffd80,
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        QWidget::show(this_01);
        local_1c4 = local_1c4 + 1;
      }
      local_1c8 = 0;
      while( true ) {
        this_00 = (QList<QWidget_*> *)(long)local_1c8;
        qVar12 = QList<QWidget_*>::size(&local_a0);
        if (qVar12 <= (long)this_00) break;
        QList<QWidget_*>::at(this_00,CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        QWidget::hide((QWidget *)0x6ff38f);
        local_1c8 = local_1c8 + 1;
      }
    }
    QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6ff3ca);
  }
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x6ff3d7);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x6ff3e4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolBarLayout::layoutActions(const QSize &size)
{
    if (dirty)
        updateGeomArray();

    QRect rect(0, 0, size.width(), size.height());

    QList<QWidget*> showWidgets, hideWidgets;

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return false;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();
    bool extensionMenuContainsOnlyWidgetActions = true;

    int space = pick(o, rect.size()) - pick(o, margins) - handleExtent;
    if (space <= 0)
        return false;  // nothing to do.

    if (popupMenu)
        popupMenu->clear();

    bool ranOutOfSpace = false;
    int rows = 0;
    int rowPos = perp(o, rect.topLeft()) + perp(o, QSize(margins.top(), margins.left()));
    int i = 0;
    while (i < items.size()) {
        QList<QLayoutStruct> a = geomArray;

        int start = i;
        int size = 0;
        int prev = -1;
        int rowHeight = 0;
        int count = 0;
        int maximumSize = 0;
        bool expansiveRow = false;
        for (; i < items.size(); ++i) {
            if (a[i].empty)
                continue;

            int newSize = size + (count == 0 ? 0 : spacing) + a[i].minimumSize;
            if (prev != -1 && newSize > space) {
                if (rows == 0)
                    ranOutOfSpace = true;
                // do we have to move the previous item to the next line to make space for
                // the extension button?
                if (count > 1 && size + spacing + extensionExtent > space)
                    i = prev;
                break;
            }

            if (expanded)
                rowHeight = qMax(rowHeight, perp(o, items.at(i)->sizeHint()));
            expansiveRow = expansiveRow || a[i].expansive;
            size = newSize;
            maximumSize += spacing + (a[i].expansive ? a[i].maximumSize : a[i].smartSizeHint());
            prev = i;
            ++count;
        }

        // stretch at the end
        a[i].sizeHint = 0;
        a[i].maximumSize = QWIDGETSIZE_MAX;
        a[i].minimumSize = 0;
        a[i].expansive = true;
        a[i].stretch = 0;
        a[i].empty = true;

        if (expansiveRow && maximumSize < space) {
            expansiveRow = false;
            a[i].maximumSize = space - maximumSize;
        }

        qGeomCalc(a, start, i - start + (expansiveRow ? 0 : 1), 0,
                    space - (ranOutOfSpace ? (extensionExtent + spacing) : 0),
                    spacing);

        for (int j = start; j < i; ++j) {
            QToolBarItem *item = items.at(j);

            if (a[j].empty) {
                if (!item->widget()->isHidden())
                    hideWidgets << item->widget();
                continue;
            }

            QPoint pos;
            rpick(o, pos) = pick(o, QSize(margins.top(), margins.left())) + handleExtent + a[j].pos;
            rperp(o, pos) = rowPos;
            QSize size;
            rpick(o, size) = a[j].size;
            if (expanded)
                rperp(o, size) = rowHeight;
            else
                rperp(o, size) = perp(o, rect.size()) - perp(o, margins);
            QRect r(pos, size);

            if (o == Qt::Horizontal)
                r = QStyle::visualRect(parentWidget()->layoutDirection(), rect, r);

            item->setGeometry(r);

            if (item->widget()->isHidden())
                showWidgets << item->widget();
        }

        if (!expanded) {
            for (int j = i; j < items.size(); ++j) {
                QToolBarItem *item = items.at(j);
                if (!item->widget()->isHidden())
                    hideWidgets << item->widget();
                if (popupMenu) {
                    if (!defaultWidgetAction(item)) {
                        popupMenu->addAction(item->action);
                        extensionMenuContainsOnlyWidgetActions = false;
                    }
                }
            }
            break;
        }

        rowPos += rowHeight + spacing;
        ++rows;
    }

    // if we are using a popup menu, not the expadning toolbar effect, we cannot move custom
    // widgets into the menu. If only custom widget actions are chopped off, the popup menu
    // is empty. So we show the little extension button to show something is chopped off,
    // but we make it disabled.
    extension->setEnabled(popupMenu == nullptr || !extensionMenuContainsOnlyWidgetActions);

    // we have to do the show/hide here, because it triggers more calls to setGeometry :(
    for (int i = 0; i < showWidgets.size(); ++i)
        showWidgets.at(i)->show();
    for (int i = 0; i < hideWidgets.size(); ++i)
        hideWidgets.at(i)->hide();

    return ranOutOfSpace;
}